

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

uint32_t WebPDemuxGetI(WebPDemuxer *dmux,WebPFormatFeature feature)

{
  WebPFormatFeature feature_local;
  WebPDemuxer *dmux_local;
  uint32_t local_4;
  
  if (dmux == (WebPDemuxer *)0x0) {
    local_4 = 0;
  }
  else {
    switch(feature) {
    case WEBP_FF_FORMAT_FLAGS:
      local_4 = dmux->feature_flags_;
      break;
    case WEBP_FF_CANVAS_WIDTH:
      local_4 = dmux->canvas_width_;
      break;
    case WEBP_FF_CANVAS_HEIGHT:
      local_4 = dmux->canvas_height_;
      break;
    case WEBP_FF_LOOP_COUNT:
      local_4 = dmux->loop_count_;
      break;
    case WEBP_FF_BACKGROUND_COLOR:
      local_4 = dmux->bgcolor_;
      break;
    case WEBP_FF_FRAME_COUNT:
      local_4 = dmux->num_frames_;
      break;
    default:
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

uint32_t WebPDemuxGetI(const WebPDemuxer* dmux, WebPFormatFeature feature) {
  if (dmux == NULL) return 0;

  switch (feature) {
    case WEBP_FF_FORMAT_FLAGS:     return dmux->feature_flags_;
    case WEBP_FF_CANVAS_WIDTH:     return (uint32_t)dmux->canvas_width_;
    case WEBP_FF_CANVAS_HEIGHT:    return (uint32_t)dmux->canvas_height_;
    case WEBP_FF_LOOP_COUNT:       return (uint32_t)dmux->loop_count_;
    case WEBP_FF_BACKGROUND_COLOR: return dmux->bgcolor_;
    case WEBP_FF_FRAME_COUNT:      return (uint32_t)dmux->num_frames_;
  }
  return 0;
}